

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_expt(sexp ctx,sexp a,sexp b)

{
  sexp_gc_var_t *psVar1;
  undefined1 auVar2 [16];
  sexp psVar3;
  ulong in_RDX;
  sexp in_RDI;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp acc;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_sint_t abs_e;
  sexp_sint_t e;
  sexp in_stack_00000068;
  sexp in_stack_00000070;
  sexp in_stack_00000078;
  sexp in_stack_ffffffffffffff98;
  sexp ctx_00;
  sexp dst;
  undefined8 ctx_01;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_8;
  
  auVar2._8_8_ = (long)in_RDX >> 0x3f;
  auVar2._0_8_ = in_RDX & 0xfffffffffffffffe;
  local_20 = SUB168(auVar2 / SEXT816(2),0);
  local_28 = local_20;
  if ((long)local_20 < 0) {
    local_28 = -local_20;
  }
  local_30 = 0x43e;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffc0,0,0x10);
  dst = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  ctx_01 = &stack0xffffffffffffffd0;
  psVar1 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  psVar3 = (sexp)&stack0xffffffffffffffb8;
  ctx_00 = (sexp)(((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa8;
  local_30 = sexp_fixnum_to_bignum(ctx_00,psVar3);
  sexp_copy_bignum((sexp)ctx_01,dst,ctx_00,(sexp_uint_t)psVar3);
  while ((sexp)local_28 != (sexp)0x0) {
    if ((local_28 & 1) != 0) {
      local_30 = sexp_bignum_mul(in_stack_00000078,in_stack_00000070,in_stack_00000068,ctx);
    }
    local_28 = (long)local_28 >> 1;
    sexp_bignum_mul(in_stack_00000078,in_stack_00000070,in_stack_00000068,ctx);
  }
  if ((long)local_20 < 0) {
    sexp_fixnum_to_bignum(ctx_00,psVar3);
    local_30 = sexp_div((sexp)__sexp_gc_preserver2.var,in_stack_00000008,unaff_retaddr);
  }
  (((sexp)local_8)->value).context.saves = psVar1;
  psVar3 = sexp_bignum_normalize(in_stack_ffffffffffffff98);
  return psVar3;
}

Assistant:

sexp sexp_bignum_expt (sexp ctx, sexp a, sexp b) {
  sexp_sint_t e = sexp_unbox_fixnum(b);
  sexp_sint_t abs_e;
  if (e < 0)
    abs_e = -e;
  else
    abs_e = e;
  sexp_gc_var2(res, acc);
  sexp_gc_preserve2(ctx, res, acc);
  res = sexp_fixnum_to_bignum(ctx, SEXP_ONE);
  acc = sexp_copy_bignum(ctx, NULL, a, 0);
  for (; abs_e; abs_e>>=1, acc=sexp_bignum_mul(ctx, NULL, acc, acc))
    if (abs_e & 1)
      res = sexp_bignum_mul(ctx, NULL, res, acc);
  if (e < 0)
    res = sexp_div(ctx, sexp_fixnum_to_bignum(ctx, SEXP_ONE), res);
  sexp_gc_release2(ctx);
  return sexp_bignum_normalize(res);
}